

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.H
# Opt level: O3

iterator __thiscall
std::
_Hashtable<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
::find(_Hashtable<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       *this,key_type *__k)

{
  anon_struct_8_0_00000001_for___align aVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  ulong uVar3;
  _Node_iterator_base<amrex::CArena::Node,_false> _Var4;
  
  aVar1 = (anon_struct_8_0_00000001_for___align)__k->m_block;
  _Var4._M_cur = (__node_type *)0x0;
  uVar3 = (ulong)aVar1 % this->_M_bucket_count;
  if ((this->_M_buckets[uVar3] != (__node_base_ptr)0x0) &&
     (_Var4._M_cur = (__node_type *)this->_M_buckets[uVar3]->_M_nxt,
     aVar1 != ((_Var4._M_cur)->super__Hash_node_value<amrex::CArena::Node,_false>).
              super__Hash_node_value_base<amrex::CArena::Node>._M_storage._M_storage.__align)) {
    while (_Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt,
          _Var4._M_cur != (__node_type *)0x0) {
      aVar2 = *(anon_struct_8_0_00000001_for___align *)
               &((_Var4._M_cur)->super__Hash_node_value<amrex::CArena::Node,_false>).
                super__Hash_node_value_base<amrex::CArena::Node>._M_storage._M_storage;
      if ((ulong)aVar2 % this->_M_bucket_count != uVar3) {
        return (iterator)(__node_type *)0x0;
      }
      if (aVar1 == aVar2) {
        return (iterator)(_Node_iterator_base<amrex::CArena::Node,_false>)_Var4._M_cur;
      }
    }
    _Var4._M_cur = (__node_type *)0x0;
  }
  return (iterator)(_Node_iterator_base<amrex::CArena::Node,_false>)_Var4._M_cur;
}

Assistant:

std::size_t operator() (const Node& n) const noexcept {
                return std::hash<void*>{}(n.m_block);
            }